

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)

{
  pgno *n64;
  uint uVar1;
  uint uVar2;
  ushort *puVar3;
  pgno pnum_00;
  sxu16 sVar4;
  int iVar5;
  int iVar6;
  lhpage *pPage;
  uint *puVar7;
  lhcell *pCell;
  ulong uVar8;
  ushort uVar9;
  unqlite_page *puVar10;
  lhpage *pMaster_00;
  uint *puVar11;
  uchar *puVar12;
  unqlite_page *pRaw;
  unqlite_page *local_38;
  
  iVar5 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,pnum,&local_38);
  if (iVar5 != 0) {
    return iVar5;
  }
  pPage = (lhpage *)local_38->pUserData;
  if (pPage == (lhpage *)0x0) {
    pPage = lhNewPage(pEngine,local_38,pMaster);
    if (pPage == (lhpage *)0x0) {
      return -1;
    }
    puVar3 = (ushort *)pPage->pRaw->zData;
    (pPage->sHdr).iOfft = *puVar3 << 8 | *puVar3 >> 8;
    (pPage->sHdr).iFree = puVar3[1] << 8 | puVar3[1] >> 8;
    n64 = &(pPage->sHdr).iSlave;
    SyBigEndianUnpack64((uchar *)(puVar3 + 2),n64);
    puVar10 = pPage->pRaw;
    puVar12 = puVar10->zData;
    uVar8 = (ulong)(pPage->sHdr).iFree;
    if (uVar8 == 0) {
      sVar4 = 0;
LAB_001138f8:
      pPage->nFree = sVar4;
      uVar8 = (ulong)(pPage->sHdr).iOfft;
      if (uVar8 == 0) {
LAB_00113a25:
        pnum_00 = *n64;
        if (pnum_00 != 0) {
          pMaster_00 = pPage;
          if (pMaster != (lhpage *)0x0) {
            pMaster_00 = pMaster;
          }
          lhLoadPage(pEngine,pnum_00,pMaster_00,(lhpage **)0x0,(int)pMaster_00);
        }
        goto LAB_0011381a;
      }
      puVar11 = (uint *)(puVar12 + uVar8);
      puVar7 = (uint *)((long)pPage->pHash->iPageSize + (long)puVar11);
      do {
        uVar1 = *puVar11;
        uVar2 = puVar11[1];
        uVar8 = *(ulong *)(puVar11 + 2);
        uVar9 = (ushort)puVar11[4] << 8 | (ushort)puVar11[4] >> 8;
        iVar5 = -0x18;
        if ((uVar9 != 0) && (puVar7 <= puVar12 + uVar9)) break;
        pCell = lhNewCell(pPage->pHash,pPage);
        iVar5 = -1;
        if (pCell == (lhcell *)0x0) break;
        pCell->iNext = uVar9;
        pCell->nKey = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
        pCell->nData = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
        pCell->nHash = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18;
        SyBigEndianUnpack64((uchar *)((long)puVar11 + 0x12),&pCell->iOvfl);
        pCell->iStart = (short)puVar11 - (short)puVar12;
        iVar6 = lhConsumeCellkey(pCell,unqliteDataConsumer,&pCell->sKey,
                                 (uint)(0x40000 < pCell->nKey));
        if (iVar6 != 0) {
          SyBlobRelease(&pCell->sKey);
        }
        iVar6 = lhInstallCell(pCell);
        if (iVar6 != 0) break;
        if ((ulong)pCell->iNext == 0) goto LAB_00113a25;
        puVar12 = pPage->pRaw->zData;
        puVar11 = (uint *)(puVar12 + pCell->iNext);
        iVar5 = -0x18;
      } while (puVar11 < puVar7);
      puVar10 = pPage->pRaw;
    }
    else {
      sVar4 = 0;
      do {
        uVar9 = *(ushort *)(puVar12 + uVar8) << 8 | *(ushort *)(puVar12 + uVar8) >> 8;
        sVar4 = sVar4 + (*(ushort *)(puVar12 + uVar8 + 2) << 8 |
                        *(ushort *)(puVar12 + uVar8 + 2) >> 8);
        if (uVar9 == 0) goto LAB_001138f8;
        uVar8 = (ulong)uVar9;
      } while ((long)uVar8 < (long)pPage->pHash->iPageSize);
      iVar5 = -0x18;
    }
    (*pEngine->pIo->xPageUnref)(puVar10);
  }
  else {
LAB_0011381a:
    iVar5 = 0;
    if (ppOut != (lhpage **)0x0) {
      *ppOut = pPage;
    }
  }
  return iVar5;
}

Assistant:

static int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)
{
	unqlite_page *pRaw;
	lhpage *pPage = 0; /* cc warning */
	int rc;
	/* Aquire the page from the pager first */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pnum,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pRaw->pUserData ){
		/* The page is already parsed and loaded in memory. Point to it */
		pPage = (lhpage *)pRaw->pUserData;
	}else{
		/* Allocate a new page */
		pPage = lhNewPage(pEngine,pRaw,pMaster);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Process the page */
		rc = lhParsePageHeader(pPage);
		if( rc == UNQLITE_OK ){
			/* Load cells */
			rc = lhLoadCells(pPage);
		}
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pPage->pRaw); /* pPage will be released inside this call */
			return rc;
		}
		if( pPage->sHdr.iSlave > 0 && iNest < 128 ){
			if( pMaster == 0 ){
				pMaster = pPage;
			}
			/* Slave page. Not a fatal error if something goes wrong here */
			lhLoadPage(pEngine,pPage->sHdr.iSlave,pMaster,0,iNest++);
		}
	}
	if( ppOut ){
		*ppOut = pPage;
	}
	return UNQLITE_OK;
}